

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_typedefs(lyout *out,lys_tpdf *tpdf,uint8_t tpdf_size,int *first)

{
  char *pcVar1;
  bool bVar2;
  int local_2c;
  int i;
  int *first_local;
  uint8_t tpdf_size_local;
  lys_tpdf *tpdf_local;
  lyout *out_local;
  
  if (tpdf_size != '\0') {
    bVar2 = false;
    if (first != (int *)0x0) {
      bVar2 = *first != 0;
    }
    pcVar1 = ",";
    if (bVar2) {
      pcVar1 = "";
    }
    ly_print(out,"%s\"typedefs\":[",pcVar1);
    for (local_2c = 0; local_2c < (int)(uint)tpdf_size; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (local_2c != 0) {
        pcVar1 = ",";
      }
      ly_print(out,"%s\"%s\"",pcVar1,tpdf[local_2c].name);
    }
    ly_print(out,"]");
    if (first != (int *)0x0) {
      *first = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_typedefs(struct lyout *out, const struct lys_tpdf *tpdf, uint8_t tpdf_size, int *first)
{
    int i;

    if (!tpdf_size) {
        return;
    }

    ly_print(out, "%s\"typedefs\":[", (first && (*first)) ? "" : ",");
    for (i = 0; i < tpdf_size; ++i) {
        ly_print(out, "%s\"%s\"", i ? "," : "", tpdf[i].name);
    }
    ly_print(out, "]");
    if (first) {
        (*first) = 0;
    }
}